

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcStatesStates
          (BeagleCPUImpl<double,_1,_0> *this,double *destP,int *states1,double *matrices1,
          int *states2,double *matrices2,int startPattern,int endPattern)

{
  int iVar1;
  int iVar2;
  int i;
  int w;
  int state2;
  int state1;
  int k;
  int v;
  int l;
  double *matrices2_local;
  int *states2_local;
  double *matrices1_local;
  int *states1_local;
  double *destP_local;
  BeagleCPUImpl<double,_1,_0> *this_local;
  
  for (l = 0; l < this->kCategoryCount; l = l + 1) {
    v = l * this->kPartialsPaddedStateCount * this->kPatternCount +
        this->kPartialsPaddedStateCount * startPattern;
    for (k = startPattern; k < endPattern; k = k + 1) {
      iVar1 = states1[k];
      iVar2 = states2[k];
      w = l * this->kMatrixSize;
      for (i = 0; i < this->kStateCount; i = i + 1) {
        destP[v] = matrices1[w + iVar1] * matrices2[w + iVar2];
        v = v + 1;
        w = this->kTransPaddedStateCount + w;
      }
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcStatesStates(REALTYPE* destP,
                                                         const int* states1,
                                                         const REALTYPE* matrices1,
                                                         const int* states2,
                                                         const REALTYPE* matrices2,
                                                         int startPattern,
                                                         int endPattern) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        for (int k = startPattern; k < endPattern; k++) {
            const int state1 = states1[k];
            const int state2 = states2[k];
            if (DEBUGGING_OUTPUT) {
                std::cerr << "calcStatesStates s1 = " << state1 << '\n';
                std::cerr << "calcStatesStates s2 = " << state2 << '\n';
            }
            int w = l * kMatrixSize;
            for (int i = 0; i < kStateCount; i++) {
                destP[v] = matrices1[w + state1] * matrices2[w + state2];
                v++;

                w += kTransPaddedStateCount;
            }
            if (P_PAD) {
                for (int pad = 0; pad < P_PAD; pad++)  {
                    destP[v] = 0.0;
                    v++;
                }
            }
        }
    }
}